

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O1

string * __thiscall
duckdb::CastExceptionText<duckdb::dtime_tz_t,duckdb::dtime_t>
          (string *__return_storage_ptr__,duckdb *this,dtime_tz_t input)

{
  long *plVar1;
  InternalException *this_00;
  long *plVar2;
  size_type __dnew;
  size_type local_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  string local_70;
  string local_50;
  
  TypeIdToString_abi_cxx11_(&local_50,(duckdb *)0xff,(PhysicalType)input.bits);
  plVar1 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x13a2ea4);
  local_b0 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_b0 == plVar2) {
    local_a0 = *plVar2;
    lStack_98 = plVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar2;
  }
  local_a8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)::std::__cxx11::string::append((char *)&local_b0);
  local_90 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_90 == plVar2) {
    local_80 = *plVar2;
    uStack_78 = (undefined4)plVar1[3];
    uStack_74 = *(undefined4 *)((long)plVar1 + 0x1c);
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar2;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_b8 = 0x28;
  local_70._M_dataplus._M_p =
       (pointer)::std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_b8);
  local_70.field_2._M_allocated_capacity = local_b8;
  builtin_strncpy(local_70._M_dataplus._M_p,"Unrecognized type for ConvertToString %s",0x28);
  local_70._M_string_length = local_b8;
  local_70._M_dataplus._M_p[local_b8] = '\0';
  InternalException::InternalException<duckdb::PhysicalType>(this_00,&local_70,INVALID);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}